

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

uint16_t TIFFFetchDirectory(TIFF *tif,uint64_t diroff,TIFFDirEntry **pdir,uint64_t *nextdiroff)

{
  uint uVar1;
  undefined2 uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint32_t local_8c;
  ulong uStack_88;
  uint32_t nextdiroff32_1;
  uint64_t dircount64_1;
  tmsize_t off;
  tmsize_t m;
  ulong uStack_68;
  uint32_t nextdiroff32;
  uint64_t dircount64;
  uint16_t *puStack_58;
  uint16_t n;
  TIFFDirEntry *mb;
  uint8_t *ma;
  TIFFDirEntry *dir;
  uint32_t dirsize;
  uint16_t dircount16;
  void *origdir;
  uint64_t *nextdiroff_local;
  TIFFDirEntry **pdir_local;
  uint64_t diroff_local;
  TIFF *tif_local;
  
  origdir = nextdiroff;
  nextdiroff_local = (uint64_t *)pdir;
  pdir_local = (TIFFDirEntry **)diroff;
  diroff_local = (uint64_t)tif;
  if (pdir == (TIFFDirEntry **)0x0) {
    __assert_fail("pdir",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x167a,
                  "uint16_t TIFFFetchDirectory(TIFF *, uint64_t, TIFFDirEntry **, uint64_t *)");
  }
  tif->tif_diroff = diroff;
  if (nextdiroff != (uint64_t *)0x0) {
    *nextdiroff = 0;
  }
  if ((tif->tif_flags & 0x800) == 0) {
    iVar3 = _TIFFSeekOK(tif,tif->tif_diroff);
    if (iVar3 == 0) {
      TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                    "%s: Seek error accessing TIFF directory",*(undefined8 *)diroff_local);
      return 0;
    }
    if ((*(uint *)(diroff_local + 0x10) & 0x80000) == 0) {
      lVar4 = (**(code **)(diroff_local + 0x458))
                        (*(undefined8 *)(diroff_local + 0x450),(long)&dir + 6,2);
      if (lVar4 != 2) {
        TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                      "%s: Can not read TIFF directory count",*(undefined8 *)diroff_local);
        return 0;
      }
      if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
        TIFFSwabShort((uint16_t *)((long)&dir + 6));
      }
      if (0x1000 < dir._6_2_) {
        TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                      "Sanity check on directory count failed, this is probably not a valid IFD offset"
                     );
        return 0;
      }
      dir._0_4_ = 0xc;
    }
    else {
      lVar4 = (**(code **)(diroff_local + 0x458))
                        (*(undefined8 *)(diroff_local + 0x450),&stack0xffffffffffffff98,8);
      if (lVar4 != 8) {
        TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                      "%s: Can not read TIFF directory count",*(undefined8 *)diroff_local);
        return 0;
      }
      if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
        TIFFSwabLong8(&stack0xffffffffffffff98);
      }
      if (0x1000 < uStack_68) {
        TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                      "Sanity check on directory count failed, this is probably not a valid IFD offset"
                     );
        return 0;
      }
      dir._6_2_ = (ushort)uStack_68;
      dir._0_4_ = 0x14;
    }
    _dirsize = (TIFFDirEntry *)
               _TIFFCheckMalloc((TIFF *)diroff_local,(ulong)dir._6_2_,(ulong)(uint)dir,
                                "to read TIFF directory");
    if (_dirsize == (TIFFDirEntry *)0x0) {
      return 0;
    }
    uVar5 = (**(code **)(diroff_local + 0x458))
                      (*(undefined8 *)(diroff_local + 0x450),_dirsize,dir._6_2_ * (uint)dir);
    if (uVar5 != dir._6_2_ * (uint)dir) {
      TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory","%.100s: Can not read TIFF directory",
                    *(undefined8 *)diroff_local);
      _TIFFfreeExt((TIFF *)diroff_local,_dirsize);
      return 0;
    }
    if (origdir != (void *)0x0) {
      if ((*(uint *)(diroff_local + 0x10) & 0x80000) == 0) {
        lVar4 = (**(code **)(diroff_local + 0x458))
                          (*(undefined8 *)(diroff_local + 0x450),(long)&m + 4,4);
        if (lVar4 != 4) {
          m._4_4_ = 0;
        }
        if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
          TIFFSwabLong((uint32_t *)((long)&m + 4));
        }
        *(ulong *)origdir = (ulong)m._4_4_;
      }
      else {
        lVar4 = (**(code **)(diroff_local + 0x458))(*(undefined8 *)(diroff_local + 0x450),origdir,8)
        ;
        if (lVar4 != 8) {
          *(undefined8 *)origdir = 0;
        }
        if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
          TIFFSwabLong8((uint64_t *)origdir);
        }
      }
    }
  }
  else {
    if (0x7fffffffffffffff < tif->tif_diroff) {
      TIFFErrorExtR(tif,"TIFFFetchDirectory","Can not read TIFF directory count");
      return 0;
    }
    dircount64_1 = tif->tif_diroff;
    if ((tif->tif_flags & 0x80000) == 0) {
      off = dircount64_1 + 2;
      if (((off < (long)dircount64_1) || (off < 2)) || (tif->tif_size < off)) {
        TIFFErrorExtR(tif,"TIFFFetchDirectory","Can not read TIFF directory count");
        return 0;
      }
      _TIFFmemcpy((void *)((long)&dir + 6),tif->tif_base + dircount64_1,2);
      dircount64_1 = dircount64_1 + 2;
      if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
        TIFFSwabShort((uint16_t *)((long)&dir + 6));
      }
      if (0x1000 < dir._6_2_) {
        TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                      "Sanity check on directory count failed, this is probably not a valid IFD offset"
                     );
        return 0;
      }
      dir._0_4_ = 0xc;
    }
    else {
      off = dircount64_1 + 8;
      if (((off < (long)dircount64_1) || (off < 8)) || (tif->tif_size < off)) {
        TIFFErrorExtR(tif,"TIFFFetchDirectory","Can not read TIFF directory count");
        return 0;
      }
      _TIFFmemcpy(&stack0xffffffffffffff78,tif->tif_base + dircount64_1,8);
      dircount64_1 = dircount64_1 + 8;
      if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
        TIFFSwabLong8(&stack0xffffffffffffff78);
      }
      if (0x1000 < uStack_88) {
        TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                      "Sanity check on directory count failed, this is probably not a valid IFD offset"
                     );
        return 0;
      }
      dir._6_2_ = (ushort)uStack_88;
      dir._0_4_ = 0x14;
    }
    if (dir._6_2_ == 0) {
      TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory",
                    "Sanity check on directory count failed, zero tag directories not supported");
      return 0;
    }
    _dirsize = (TIFFDirEntry *)
               _TIFFCheckMalloc((TIFF *)diroff_local,(ulong)dir._6_2_,(ulong)(uint)dir,
                                "to read TIFF directory");
    if (_dirsize == (TIFFDirEntry *)0x0) {
      return 0;
    }
    off = dircount64_1 + dir._6_2_ * (uint)dir;
    if (((off < (long)dircount64_1) || (off < (long)(ulong)(dir._6_2_ * (uint)dir))) ||
       (*(long *)(diroff_local + 0x438) < off)) {
      TIFFErrorExtR((TIFF *)diroff_local,"TIFFFetchDirectory","Can not read TIFF directory");
      _TIFFfreeExt((TIFF *)diroff_local,_dirsize);
      return 0;
    }
    _TIFFmemcpy(_dirsize,(void *)(*(long *)(diroff_local + 0x430) + dircount64_1),
                (ulong)(dir._6_2_ * (uint)dir));
    if (origdir != (void *)0x0) {
      dircount64_1 = dir._6_2_ * (uint)dir + dircount64_1;
      if ((*(uint *)(diroff_local + 0x10) & 0x80000) == 0) {
        off = dircount64_1 + 4;
        if (((off < (long)dircount64_1) || (off < 4)) || (*(long *)(diroff_local + 0x438) < off)) {
          local_8c = 0;
        }
        else {
          _TIFFmemcpy(&local_8c,(void *)(*(long *)(diroff_local + 0x430) + dircount64_1),4);
        }
        if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
          TIFFSwabLong(&local_8c);
        }
        *(ulong *)origdir = (ulong)local_8c;
      }
      else {
        off = dircount64_1 + 8;
        if (((off < (long)dircount64_1) || (off < 8)) || (*(long *)(diroff_local + 0x438) < off)) {
          *(undefined8 *)origdir = 0;
        }
        else {
          _TIFFmemcpy(origdir,(void *)(*(long *)(diroff_local + 0x430) + dircount64_1),8);
        }
        if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
          TIFFSwabLong8((uint64_t *)origdir);
        }
      }
    }
  }
  puStack_58 = (uint16_t *)
               _TIFFCheckMalloc((TIFF *)diroff_local,(ulong)dir._6_2_,0x20,"to read TIFF directory")
  ;
  ma = (uint8_t *)puStack_58;
  if (puStack_58 == (uint16_t *)0x0) {
    _TIFFfreeExt((TIFF *)diroff_local,_dirsize);
    tif_local._6_2_ = 0;
  }
  else {
    mb = _dirsize;
    for (dircount64._6_2_ = 0; dircount64._6_2_ < dir._6_2_; dircount64._6_2_ = dircount64._6_2_ + 1
        ) {
      *(undefined1 *)(puStack_58 + 0xc) = 0;
      if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
        TIFFSwabShort(&mb->tdir_tag);
      }
      *puStack_58 = mb->tdir_tag;
      mb = (TIFFDirEntry *)&mb->tdir_type;
      if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
        TIFFSwabShort((uint16_t *)mb);
      }
      puStack_58[1] = mb->tdir_tag;
      mb = (TIFFDirEntry *)&mb->tdir_type;
      if ((*(uint *)(diroff_local + 0x10) & 0x80000) == 0) {
        if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
          TIFFSwabLong((uint32_t *)mb);
        }
        uVar1._0_2_ = mb->tdir_tag;
        uVar1._2_2_ = mb->tdir_type;
        *(ulong *)(puStack_58 + 4) = (ulong)uVar1;
        puStack_58[8] = 0;
        puStack_58[9] = 0;
        puStack_58[10] = 0;
        puStack_58[0xb] = 0;
        uVar2 = *(undefined2 *)&mb->field_0x6;
        puStack_58[8] = *(undefined2 *)&mb->field_0x4;
        puStack_58[9] = uVar2;
      }
      else {
        if ((*(uint *)(diroff_local + 0x10) & 0x80) != 0) {
          TIFFSwabLong8((uint64_t *)mb);
        }
        uVar6 = TIFFReadUInt64((uint8_t *)mb);
        *(uint64_t *)(puStack_58 + 4) = uVar6;
        mb = (TIFFDirEntry *)&mb->tdir_count;
        uVar6 = TIFFReadUInt64((uint8_t *)mb);
        *(uint64_t *)(puStack_58 + 8) = uVar6;
      }
      mb = (TIFFDirEntry *)&mb->tdir_count;
      puStack_58 = puStack_58 + 0x10;
    }
    _TIFFfreeExt((TIFF *)diroff_local,_dirsize);
    *nextdiroff_local = (uint64_t)ma;
    tif_local._6_2_ = dir._6_2_;
  }
  return tif_local._6_2_;
}

Assistant:

static uint16_t TIFFFetchDirectory(TIFF *tif, uint64_t diroff,
                                   TIFFDirEntry **pdir, uint64_t *nextdiroff)
{
    static const char module[] = "TIFFFetchDirectory";

    void *origdir;
    uint16_t dircount16;
    uint32_t dirsize;
    TIFFDirEntry *dir;
    uint8_t *ma;
    TIFFDirEntry *mb;
    uint16_t n;

    assert(pdir);

    tif->tif_diroff = diroff;
    if (nextdiroff)
        *nextdiroff = 0;
    if (!isMapped(tif))
    {
        if (!SeekOK(tif, tif->tif_diroff))
        {
            TIFFErrorExtR(tif, module,
                          "%s: Seek error accessing TIFF directory",
                          tif->tif_name);
            return 0;
        }
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (!ReadOK(tif, &dircount16, sizeof(uint16_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            if (!ReadOK(tif, &dircount64, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        if (!ReadOK(tif, origdir, (tmsize_t)(dircount16 * dirsize)))
        {
            TIFFErrorExtR(tif, module, "%.100s: Can not read TIFF directory",
                          tif->tif_name);
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        /*
         * Read offset to next directory for sequential scans if
         * needed.
         */
        if (nextdiroff)
        {
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                if (!ReadOK(tif, &nextdiroff32, sizeof(uint32_t)))
                    nextdiroff32 = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                if (!ReadOK(tif, nextdiroff, sizeof(uint64_t)))
                    *nextdiroff = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    else
    {
        tmsize_t m;
        tmsize_t off;
        if (tif->tif_diroff > (uint64_t)INT64_MAX)
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
            return (0);
        }
        off = (tmsize_t)tif->tif_diroff;

        /*
         * Check for integer overflow when validating the dir_off,
         * otherwise a very high offset may cause an OOB read and
         * crash the client. Make two comparisons instead of
         *
         *  off + sizeof(uint16_t) > tif->tif_size
         *
         * to avoid overflow.
         */
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            m = off + sizeof(uint16_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint16_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount16, tif->tif_base + off, sizeof(uint16_t));
            }
            off += sizeof(uint16_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            m = off + sizeof(uint64_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount64, tif->tif_base + off, sizeof(uint64_t));
            }
            off += sizeof(uint64_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        if (dircount16 == 0)
        {
            TIFFErrorExtR(tif, module,
                          "Sanity check on directory count failed, zero tag "
                          "directories not supported");
            return 0;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        m = off + dircount16 * dirsize;
        if ((m < off) || (m < (tmsize_t)(dircount16 * dirsize)) ||
            (m > tif->tif_size))
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory");
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        else
        {
            _TIFFmemcpy(origdir, tif->tif_base + off, dircount16 * dirsize);
        }
        if (nextdiroff)
        {
            off += dircount16 * dirsize;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                m = off + sizeof(uint32_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint32_t)) ||
                    (m > tif->tif_size))
                    nextdiroff32 = 0;
                else
                    _TIFFmemcpy(&nextdiroff32, tif->tif_base + off,
                                sizeof(uint32_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                m = off + sizeof(uint64_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                    (m > tif->tif_size))
                    *nextdiroff = 0;
                else
                    _TIFFmemcpy(nextdiroff, tif->tif_base + off,
                                sizeof(uint64_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    dir = (TIFFDirEntry *)_TIFFCheckMalloc(
        tif, dircount16, sizeof(TIFFDirEntry), "to read TIFF directory");
    if (dir == 0)
    {
        _TIFFfreeExt(tif, origdir);
        return 0;
    }
    ma = (uint8_t *)origdir;
    mb = dir;
    for (n = 0; n < dircount16; n++)
    {
        mb->tdir_ignore = FALSE;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_tag = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_type = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong((uint32_t *)ma);
            mb->tdir_count = (uint64_t)(*(uint32_t *)ma);
            ma += sizeof(uint32_t);
            mb->tdir_offset.toff_long8 = 0;
            *(uint32_t *)(&mb->tdir_offset) = *(uint32_t *)ma;
            ma += sizeof(uint32_t);
        }
        else
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8((uint64_t *)ma);
            mb->tdir_count = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
            mb->tdir_offset.toff_long8 = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
        }
        mb++;
    }
    _TIFFfreeExt(tif, origdir);
    *pdir = dir;
    return dircount16;
}